

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QByteArray,QByteArray>::emplace<QByteArray_const&>
          (QHash<QByteArray,QByteArray> *this,QByteArray *key,QByteArray *args)

{
  QArrayData *pQVar1;
  ulong uVar2;
  Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *pDVar3;
  long in_FS_OFFSET;
  piter pVar4;
  QByteArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QArrayData **)this;
  if (pQVar1 == (QArrayData *)0x0) {
LAB_00125906:
    pDVar3 = *(Data<QHashPrivate::Node<QByteArray,_QByteArray>_> **)this;
    local_38.d.d = (Data *)pQVar1;
    if ((pDVar3 == (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0) ||
       (1 < (uint)(pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar3 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::detached(pDVar3);
      *(Data<QHashPrivate::Node<QByteArray,_QByteArray>_> **)this = pDVar3;
    }
    pVar4 = (piter)emplace_helper<QByteArray_const&>(this,key,args);
    QHash<QByteArray,_QByteArray>::~QHash((QHash<QByteArray,_QByteArray> *)&local_38);
  }
  else {
    if (1 < (uint)(pQVar1->ref_)._q_value.super___atomic_base<int>._M_i) {
      if ((pQVar1 != (QArrayData *)0x0) &&
         ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i != -1)) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_00125906;
    }
    uVar2._0_4_ = pQVar1[1].ref_;
    uVar2._4_4_ = pQVar1[1].flags;
    if ((ulong)pQVar1->alloc < uVar2 >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar4 = (piter)emplace_helper<QByteArray_const&>(this,key,args);
        return (iterator)pVar4;
      }
      goto LAB_001259b3;
    }
    local_38.d.d = (args->d).d;
    local_38.d.ptr = (args->d).ptr;
    local_38.d.size = (args->d).size;
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_38.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_38.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pVar4 = (piter)QHash<QByteArray,_QByteArray>::emplace_helper<QByteArray>
                             ((QHash<QByteArray,_QByteArray> *)this,key,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar4;
  }
LAB_001259b3:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }